

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O1

void __thiscall
duckdb::PreparedStatementData::CheckParameterCount
          (PreparedStatementData *this,idx_t parameter_count)

{
  unsigned_long params;
  BinderException *this_00;
  string local_48;
  
  params = (this->properties).parameter_count;
  if (params == parameter_count) {
    return;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Parameter/argument count mismatch for prepared statement. Expected %llu, got %llu","")
  ;
  BinderException::BinderException<unsigned_long,unsigned_long>
            (this_00,&local_48,params,parameter_count);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PreparedStatementData::CheckParameterCount(idx_t parameter_count) {
	const auto required = properties.parameter_count;
	if (parameter_count != required) {
		throw BinderException("Parameter/argument count mismatch for prepared statement. Expected %llu, got %llu",
		                      required, parameter_count);
	}
}